

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

mod2entry * mod2sparse_find(mod2sparse *m,int row,int col)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  mod2entry *ce;
  mod2entry *re;
  mod2entry *local_28;
  mod2entry *local_20;
  mod2entry *local_8;
  
  if ((((in_ESI < 0) || (*in_RDI <= in_ESI)) || (in_EDX < 0)) || (in_RDI[1] <= in_EDX)) {
    fprintf(_stderr,"mod2sparse_find: row or column index out of bounds\n");
    exit(1);
  }
  local_8 = *(mod2entry **)(*(long *)(in_RDI + 2) + (long)in_ESI * 0x38 + 8);
  if ((local_8->row < 0) || (local_8->col < in_EDX)) {
    local_8 = (mod2entry *)0x0;
  }
  else if (local_8->col != in_EDX) {
    local_8 = *(mod2entry **)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x38 + 0x18);
    if ((local_8->row < 0) || (local_8->row < in_ESI)) {
      local_8 = (mod2entry *)0x0;
    }
    else if (local_8->row != in_ESI) {
      local_28 = *(mod2entry **)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x38 + 0x20);
      for (local_20 = *(mod2entry **)(*(long *)(in_RDI + 2) + (long)in_ESI * 0x38 + 0x10);
          (-1 < local_20->row && (local_20->col <= in_EDX)); local_20 = local_20->right) {
        if (local_20->col == in_EDX) {
          return local_20;
        }
        if ((local_28->row < 0) || (in_ESI < local_28->row)) {
          return (mod2entry *)0x0;
        }
        if (local_28->row == in_ESI) {
          return local_28;
        }
        local_28 = local_28->down;
      }
      local_8 = (mod2entry *)0x0;
    }
  }
  return local_8;
}

Assistant:

mod2entry *mod2sparse_find
( mod2sparse *m,
  int row,
  int col
)
{ 
  mod2entry *re, *ce;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_find: row or column index out of bounds\n");
    exit(1);
  }

  /* Check last entries in row and column. */

  re = mod2sparse_last_in_row(m,row);
  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { return 0;
  }
  if (mod2sparse_col(re)==col) 
  { return re;
  }

  ce = mod2sparse_last_in_col(m,col);
  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row)
  { return 0;
  }
  if (mod2sparse_row(ce)==row)
  { return ce;
  }

  /* Search row and column in parallel, from the front. */

  re = mod2sparse_first_in_row(m,row);
  ce = mod2sparse_first_in_col(m,col);

  for (;;)
  { 
    if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
    { return 0;
    } 
    if (mod2sparse_col(re)==col) 
    { return re;
    }

    if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
    { return 0;
    } 
    if (mod2sparse_row(ce)==row)
    { return ce;
    }

    re = mod2sparse_next_in_row(re);
    ce = mod2sparse_next_in_col(ce);
  }
}